

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

bool __thiscall
ON_wString::EqualOrdinal(ON_wString *this,wchar_t *other_string,bool bOrdinalIgnoreCase)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  wchar_t *string1;
  
  element_count1 = Length(this);
  iVar2 = Length(other_string);
  if (element_count1 == iVar2) {
    string1 = operator_cast_to_wchar_t_(this);
    bVar1 = EqualOrdinal(string1,element_count1,other_string,element_count1,bOrdinalIgnoreCase);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_wString::EqualOrdinal(
  const wchar_t* other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  const int length = Length();
  return (length == ON_wString::Length(other_string))
    && ON_wString::EqualOrdinal(
    static_cast< const wchar_t* >(*this),
    length,
    other_string,
    length,
    bOrdinalIgnoreCase
    );
}